

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall ncnn::Extractor::~Extractor(Extractor *this)

{
  ExtractorPrivate *pEVar1;
  
  this->_vptr_Extractor = (_func_int **)&PTR__Extractor_0064f448;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::_M_erase_at_end
            (&this->d->blob_mats,
             (this->d->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start);
  pEVar1 = this->d;
  if (pEVar1 != (ExtractorPrivate *)0x0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&pEVar1->blob_mats);
    operator_delete(pEVar1,0x60);
    return;
  }
  return;
}

Assistant:

Extractor::~Extractor()
{
    clear();

    delete d;
}